

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_priority_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  int iVar2;
  nghttp2_stream *pnVar3;
  nghttp2_session *in_RSI;
  nghttp2_frame *in_RDI;
  nghttp2_stream *stream;
  nghttp2_session *in_stack_00000008;
  int rv;
  void *in_stack_00000028;
  nghttp2_stream_state in_stack_00000034;
  nghttp2_priority_spec *in_stack_00000038;
  uint8_t in_stack_00000043;
  int32_t in_stack_00000044;
  nghttp2_session *in_stack_00000048;
  undefined8 in_stack_ffffffffffffffd8;
  uint32_t error_code;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  error_code = (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  iVar1 = session_no_rfc7540_pri_no_fallback((nghttp2_session *)&in_RDI->hd);
  if (iVar1 != 0) {
    __assert_fail("!session_no_rfc7540_pri_no_fallback(session)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                  ,0x1151,
                  "int nghttp2_session_on_priority_received(nghttp2_session *, nghttp2_frame *)");
  }
  if (*(int *)&(in_RSI->streams).mem == 0) {
    iVar1 = session_handle_invalid_connection
                      ((nghttp2_session *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                       (int)((ulong)in_RSI >> 0x20),
                       (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  else if ((int)(in_RSI->streams).size == *(int *)&(in_RSI->streams).mem) {
    iVar1 = nghttp2_session_terminate_session_with_reason
                      ((nghttp2_session *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),error_code,
                       (char *)0x111fc5);
  }
  else if (*(char *)((long)in_RDI + 0xb74) == '\0') {
    iVar1 = session_call_on_frame_received
                      (in_RSI,(nghttp2_frame *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  else {
    pnVar3 = nghttp2_session_get_stream_raw
                       ((nghttp2_session *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),error_code);
    if (pnVar3 == (nghttp2_stream *)0x0) {
      iVar1 = session_detect_idle_stream((nghttp2_session *)0x0,0);
      if (iVar1 == 0) {
        return 0;
      }
      pnVar3 = nghttp2_session_open_stream
                         (in_stack_00000048,in_stack_00000044,in_stack_00000043,in_stack_00000038,
                          in_stack_00000034,in_stack_00000028);
      if (pnVar3 == (nghttp2_stream *)0x0) {
        return -0x385;
      }
      iVar1 = nghttp2_session_adjust_idle_stream
                        ((nghttp2_session *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      iVar2 = nghttp2_is_fatal(iVar1);
    }
    else {
      iVar1 = nghttp2_session_reprioritize_stream
                        (in_stack_00000008,stream,
                         (nghttp2_priority_spec *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      iVar2 = nghttp2_is_fatal(iVar1);
      if (iVar2 != 0) {
        return iVar1;
      }
      iVar1 = nghttp2_session_adjust_idle_stream
                        ((nghttp2_session *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      iVar2 = nghttp2_is_fatal(iVar1);
    }
    if (iVar2 == 0) {
      iVar1 = session_call_on_frame_received
                        (in_RSI,(nghttp2_frame *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_session_on_priority_received(nghttp2_session *session,
                                         nghttp2_frame *frame) {
  int rv;
  nghttp2_stream *stream;

  assert(!session_no_rfc7540_pri_no_fallback(session));

  if (frame->hd.stream_id == 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "PRIORITY: stream_id == 0");
  }

  if (frame->priority.pri_spec.stream_id == frame->hd.stream_id) {
    return nghttp2_session_terminate_session_with_reason(
      session, NGHTTP2_PROTOCOL_ERROR, "depend on itself");
  }

  if (!session->server) {
    /* Re-prioritization works only in server */
    return session_call_on_frame_received(session, frame);
  }

  stream = nghttp2_session_get_stream_raw(session, frame->hd.stream_id);

  if (!stream) {
    /* PRIORITY against idle stream can create anchor node in
       dependency tree. */
    if (!session_detect_idle_stream(session, frame->hd.stream_id)) {
      return 0;
    }

    stream = nghttp2_session_open_stream(
      session, frame->hd.stream_id, NGHTTP2_STREAM_FLAG_NONE,
      &frame->priority.pri_spec, NGHTTP2_STREAM_IDLE, NULL);

    if (stream == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }

    rv = nghttp2_session_adjust_idle_stream(session);
    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
  } else {
    rv = nghttp2_session_reprioritize_stream(session, stream,
                                             &frame->priority.pri_spec);

    if (nghttp2_is_fatal(rv)) {
      return rv;
    }

    rv = nghttp2_session_adjust_idle_stream(session);
    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
  }

  return session_call_on_frame_received(session, frame);
}